

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall
btSoftBody::btSoftBody
          (btSoftBody *this,btSoftBodyWorldInfo *worldInfo,int node_count,btVector3 *x,btScalar *m)

{
  btScalar *pbVar1;
  float fVar2;
  undefined8 uVar3;
  int iVar4;
  Node *ptr;
  Material *pMVar5;
  Node *pNVar6;
  long lVar7;
  btDbvtNode *pbVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  byte bVar13;
  float extraout_XMM0_Da;
  btScalar bVar14;
  float fVar15;
  btScalar bVar16;
  float fVar17;
  btScalar bVar18;
  btScalar bVar19;
  btDbvtAabbMm box;
  btDbvtVolume local_50;
  
  bVar13 = 0;
  btCollisionObject::btCollisionObject(&this->super_btCollisionObject);
  (this->super_btCollisionObject)._vptr_btCollisionObject = (_func_int **)&PTR__btSoftBody_00229238;
  (this->m_collisionDisabledObjects).m_ownsMemory = true;
  (this->m_collisionDisabledObjects).m_data = (btCollisionObject **)0x0;
  (this->m_collisionDisabledObjects).m_size = 0;
  (this->m_collisionDisabledObjects).m_capacity = 0;
  this->m_softBodySolver = (btSoftBodySolver *)0x0;
  (this->m_cfg).m_vsequence.m_ownsMemory = true;
  (this->m_cfg).m_vsequence.m_data = (_ *)0x0;
  (this->m_cfg).m_vsequence.m_size = 0;
  (this->m_cfg).m_vsequence.m_capacity = 0;
  (this->m_cfg).m_psequence.m_ownsMemory = true;
  (this->m_cfg).m_psequence.m_data = (_ *)0x0;
  (this->m_cfg).m_psequence.m_size = 0;
  (this->m_cfg).m_psequence.m_capacity = 0;
  (this->m_cfg).m_dsequence.m_ownsMemory = true;
  (this->m_cfg).m_dsequence.m_data = (_ *)0x0;
  (this->m_cfg).m_dsequence.m_size = 0;
  (this->m_cfg).m_dsequence.m_capacity = 0;
  (this->m_pose).m_pos.m_ownsMemory = true;
  (this->m_pose).m_pos.m_data = (btVector3 *)0x0;
  (this->m_pose).m_pos.m_size = 0;
  (this->m_pose).m_pos.m_capacity = 0;
  (this->m_pose).m_wgh.m_ownsMemory = true;
  (this->m_pose).m_wgh.m_data = (float *)0x0;
  (this->m_pose).m_wgh.m_size = 0;
  (this->m_pose).m_wgh.m_capacity = 0;
  this->m_worldInfo = worldInfo;
  (this->m_notes).m_ownsMemory = true;
  (this->m_notes).m_data = (Note *)0x0;
  (this->m_notes).m_size = 0;
  (this->m_notes).m_capacity = 0;
  (this->m_nodes).m_ownsMemory = true;
  (this->m_nodes).m_data = (Node *)0x0;
  (this->m_nodes).m_size = 0;
  (this->m_nodes).m_capacity = 0;
  (this->m_links).m_ownsMemory = true;
  (this->m_links).m_data = (Link *)0x0;
  (this->m_links).m_size = 0;
  (this->m_links).m_capacity = 0;
  (this->m_faces).m_ownsMemory = true;
  (this->m_faces).m_data = (Face *)0x0;
  (this->m_faces).m_size = 0;
  (this->m_faces).m_capacity = 0;
  (this->m_tetras).m_ownsMemory = true;
  (this->m_tetras).m_data = (Tetra *)0x0;
  (this->m_tetras).m_size = 0;
  (this->m_tetras).m_capacity = 0;
  (this->m_anchors).m_ownsMemory = true;
  (this->m_anchors).m_data = (Anchor *)0x0;
  (this->m_anchors).m_size = 0;
  (this->m_anchors).m_capacity = 0;
  (this->m_rcontacts).m_ownsMemory = true;
  (this->m_rcontacts).m_data = (RContact *)0x0;
  (this->m_rcontacts).m_size = 0;
  (this->m_rcontacts).m_capacity = 0;
  (this->m_scontacts).m_ownsMemory = true;
  (this->m_scontacts).m_data = (SContact *)0x0;
  (this->m_scontacts).m_size = 0;
  (this->m_scontacts).m_capacity = 0;
  (this->m_joints).m_ownsMemory = true;
  (this->m_joints).m_data = (Joint **)0x0;
  (this->m_joints).m_size = 0;
  (this->m_joints).m_capacity = 0;
  (this->m_materials).m_ownsMemory = true;
  (this->m_materials).m_data = (Material **)0x0;
  (this->m_materials).m_size = 0;
  (this->m_materials).m_capacity = 0;
  btDbvt::btDbvt(&this->m_ndbvt);
  btDbvt::btDbvt(&this->m_fdbvt);
  btDbvt::btDbvt(&this->m_cdbvt);
  (this->m_clusters).m_ownsMemory = true;
  (this->m_clusters).m_data = (Cluster **)0x0;
  (this->m_clusters).m_size = 0;
  (this->m_clusters).m_capacity = 0;
  (this->m_clusterConnectivity).m_ownsMemory = true;
  (this->m_clusterConnectivity).m_data = (bool *)0x0;
  (this->m_clusterConnectivity).m_size = 0;
  (this->m_clusterConnectivity).m_capacity = 0;
  (this->m_userIndexMapping).m_ownsMemory = true;
  (this->m_userIndexMapping).m_data = (int *)0x0;
  (this->m_userIndexMapping).m_size = 0;
  (this->m_userIndexMapping).m_capacity = 0;
  initDefaults(this);
  pMVar5 = appendMaterial(this);
  pMVar5->m_kLST = 1.0;
  pMVar5->m_kAST = 1.0;
  pMVar5->m_kVST = 1.0;
  pMVar5->m_flags = 1;
  (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
  iVar4 = (this->m_nodes).m_size;
  if (iVar4 <= node_count) {
    if ((iVar4 < node_count) && ((this->m_nodes).m_capacity < node_count)) {
      if (node_count == 0) {
        pNVar6 = (Node *)0x0;
      }
      else {
        pNVar6 = (Node *)btAlignedAllocInternal((long)node_count * 0x78,0x10);
      }
      lVar7 = (long)(this->m_nodes).m_size;
      if (0 < lVar7) {
        lVar10 = 0;
        do {
          puVar11 = (undefined8 *)
                    ((long)&(((Node *)(&((this->m_nodes).m_data)->m_x + -1))->super_Feature).
                            super_Element.m_tag + lVar10);
          puVar12 = (undefined8 *)
                    ((long)&(((Node *)(&pNVar6->m_x + -1))->super_Feature).super_Element.m_tag +
                    lVar10);
          for (lVar9 = 0xf; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar12 = *puVar11;
            puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
            puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
          }
          lVar10 = lVar10 + 0x78;
        } while (lVar7 * 0x78 - lVar10 != 0);
      }
      ptr = (this->m_nodes).m_data;
      if (ptr != (Node *)0x0) {
        if ((this->m_nodes).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_nodes).m_data = (Node *)0x0;
      }
      (this->m_nodes).m_ownsMemory = true;
      (this->m_nodes).m_data = pNVar6;
      (this->m_nodes).m_capacity = node_count;
    }
    if (iVar4 < node_count) {
      lVar7 = (long)node_count - (long)iVar4;
      lVar10 = (long)iVar4 * 0x78;
      do {
        pNVar6 = (this->m_nodes).m_data;
        puVar11 = (undefined8 *)((long)(&pNVar6->m_n + 1) + lVar10);
        *puVar11 = 0;
        puVar11[1] = 0;
        puVar11 = (undefined8 *)((long)(pNVar6->m_n).m_floats + lVar10);
        *puVar11 = 0;
        puVar11[1] = 0;
        puVar11 = (undefined8 *)((long)(pNVar6->m_f).m_floats + lVar10);
        *puVar11 = 0;
        puVar11[1] = 0;
        puVar11 = (undefined8 *)((long)(pNVar6->m_v).m_floats + lVar10);
        *puVar11 = 0;
        puVar11[1] = 0;
        puVar11 = (undefined8 *)((long)(pNVar6->m_q).m_floats + lVar10);
        *puVar11 = 0;
        puVar11[1] = 0;
        puVar11 = (undefined8 *)((long)(pNVar6->m_x).m_floats + lVar10);
        *puVar11 = 0;
        puVar11[1] = 0;
        puVar11 = (undefined8 *)
                  ((long)&(((Node *)(&pNVar6->m_x + -1))->super_Feature).super_Element.m_tag +
                  lVar10);
        *puVar11 = 0;
        puVar11[1] = 0;
        *(undefined8 *)((long)(&pNVar6->m_n + 2) + lVar10) = 0;
        lVar10 = lVar10 + 0x78;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
  }
  (this->m_nodes).m_size = node_count;
  if (0 < node_count) {
    lVar7 = 0;
    do {
      pNVar6 = (this->m_nodes).m_data;
      bVar14 = 0.0;
      bVar16 = 0.0;
      bVar18 = 0.0;
      bVar19 = 0.0;
      puVar11 = (undefined8 *)((long)(&pNVar6->m_n + 1) + lVar7);
      *puVar11 = 0;
      puVar11[1] = 0;
      puVar11 = (undefined8 *)((long)(pNVar6->m_n).m_floats + lVar7);
      *puVar11 = 0;
      puVar11[1] = 0;
      puVar11 = (undefined8 *)((long)(pNVar6->m_f).m_floats + lVar7);
      *puVar11 = 0;
      puVar11[1] = 0;
      puVar11 = (undefined8 *)((long)(pNVar6->m_v).m_floats + lVar7);
      *puVar11 = 0;
      puVar11[1] = 0;
      puVar11 = (undefined8 *)((long)(pNVar6->m_q).m_floats + lVar7);
      *puVar11 = 0;
      puVar11[1] = 0;
      puVar11 = (undefined8 *)((long)(pNVar6->m_x).m_floats + lVar7);
      *puVar11 = 0;
      puVar11[1] = 0;
      puVar11 = (undefined8 *)
                ((long)&(((Node *)(&pNVar6->m_x + -1))->super_Feature).super_Element.m_tag + lVar7);
      *puVar11 = 0;
      puVar11[1] = 0;
      *(undefined8 *)((long)(&pNVar6->m_n + 2) + lVar7) = 0;
      if (x == (btVector3 *)0x0) {
        x = (btVector3 *)0x0;
      }
      else {
        bVar14 = x->m_floats[0];
        bVar16 = x->m_floats[1];
        bVar18 = x->m_floats[2];
        bVar19 = x->m_floats[3];
        x = x + 1;
      }
      pbVar1 = (btScalar *)((long)(pNVar6->m_x).m_floats + lVar7);
      *pbVar1 = bVar14;
      pbVar1[1] = bVar16;
      pbVar1[2] = bVar18;
      pbVar1[3] = bVar19;
      puVar11 = (undefined8 *)((long)(pNVar6->m_x).m_floats + lVar7);
      uVar3 = puVar11[1];
      puVar12 = (undefined8 *)((long)(pNVar6->m_q).m_floats + lVar7);
      *puVar12 = *puVar11;
      puVar12[1] = uVar3;
      if (m == (btScalar *)0x0) {
        m = (btScalar *)0x0;
        bVar14 = 1.0;
      }
      else {
        bVar14 = *m;
        m = m + 1;
      }
      *(uint *)((long)(&pNVar6->m_n + 1) + lVar7) = -(uint)(0.0 < bVar14) & (uint)(1.0 / bVar14);
      uVar3 = *(undefined8 *)((long)(pNVar6->m_x).m_floats + lVar7);
      fVar15 = (float)uVar3;
      fVar17 = (float)((ulong)uVar3 >> 0x20);
      fVar2 = *(float *)((long)(pNVar6->m_x).m_floats + lVar7 + 8);
      local_50.mi.m_floats[1] = fVar17 - extraout_XMM0_Da;
      local_50.mi.m_floats[0] = fVar15 - extraout_XMM0_Da;
      local_50.mi.m_floats[2] = fVar2 - extraout_XMM0_Da;
      local_50.mi.m_floats[3] = 0.0;
      local_50.mx.m_floats[1] = fVar17 + extraout_XMM0_Da;
      local_50.mx.m_floats[0] = fVar15 + extraout_XMM0_Da;
      local_50.mx.m_floats[2] = fVar2 + extraout_XMM0_Da;
      local_50.mx.m_floats[3] = 0.0;
      pbVar8 = btDbvt::insert(&this->m_ndbvt,&local_50,
                              (void *)((long)&(((Node *)(&pNVar6->m_x + -1))->super_Feature).
                                              super_Element.m_tag + lVar7));
      *(btDbvtNode **)((long)(&pNVar6->m_n + 1) + lVar7 + 8) = pbVar8;
      *(Material **)((long)(pNVar6->m_x).m_floats + lVar7 + -8) = pMVar5;
      lVar7 = lVar7 + 0x78;
    } while ((ulong)(uint)node_count * 0x78 - lVar7 != 0);
  }
  updateBounds(this);
  return;
}

Assistant:

btSoftBody::btSoftBody(btSoftBodyWorldInfo*	worldInfo,int node_count,  const btVector3* x,  const btScalar* m)
:m_softBodySolver(0),m_worldInfo(worldInfo)
{	
	/* Init		*/ 
	initDefaults();

	/* Default material	*/ 
	Material*	pm=appendMaterial();
	pm->m_kLST	=	1;
	pm->m_kAST	=	1;
	pm->m_kVST	=	1;
	pm->m_flags	=	fMaterial::Default;

	/* Nodes			*/ 
	const btScalar		margin=getCollisionShape()->getMargin();
	m_nodes.resize(node_count);
	for(int i=0,ni=node_count;i<ni;++i)
	{	
		Node&	n=m_nodes[i];
		ZeroInitialize(n);
		n.m_x		=	x?*x++:btVector3(0,0,0);
		n.m_q		=	n.m_x;
		n.m_im		=	m?*m++:1;
		n.m_im		=	n.m_im>0?1/n.m_im:0;
		n.m_leaf	=	m_ndbvt.insert(btDbvtVolume::FromCR(n.m_x,margin),&n);
		n.m_material=	pm;
	}
	updateBounds();	

}